

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-interp.cc
# Opt level: O0

void __thiscall InterpTest_Rot13_Test::TestBody(InterpTest_Rot13_Test *this)

{
  Limits limits;
  initializer_list<wabt::interp::Ref> __l;
  initializer_list<wabt::Type> __l_00;
  initializer_list<wabt::Type> __l_01;
  initializer_list<wabt::Type> __l_02;
  initializer_list<wabt::Type> __l_03;
  initializer_list<wabt::Type> __l_04;
  initializer_list<unsigned_char> __l_05;
  bool bVar1;
  Memory *this_00;
  HostFunc *pHVar2;
  DefinedFunc *pDVar3;
  char *pcVar4;
  AssertHelper local_590;
  Message local_588;
  undefined1 local_580 [8];
  AssertionResult gtest_ar_3;
  Message local_568;
  vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> local_560;
  Result local_548;
  Enum local_544;
  undefined1 local_540 [8];
  AssertionResult gtest_ar_2;
  Message local_528;
  undefined1 local_520 [8];
  AssertionResult gtest_ar_1;
  AssertHelper local_508;
  Message local_500;
  vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> local_4f8;
  Result local_4e0;
  Enum local_4dc;
  undefined1 local_4d8 [8];
  AssertionResult gtest_ar;
  Ptr trap;
  Values results;
  Ptr rot13;
  Ref local_478;
  size_t local_470;
  size_t local_468;
  iterator local_460;
  size_type local_458;
  vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_> local_450;
  Callback local_438;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_418;
  allocator<wabt::Type> local_3f9;
  Type local_3f8;
  Type TStack_3f4;
  iterator local_3f0;
  size_type local_3e8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_3e0;
  FuncType local_3c8;
  undefined1 local_388 [8];
  Ptr buf_done_func;
  anon_class_16_2_e78ae302 buf_done;
  allocator<wabt::Type> local_33d;
  Type local_33c;
  iterator local_338;
  size_type local_330;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_328;
  allocator<wabt::Type> local_309;
  Type local_308;
  Type TStack_304;
  iterator local_300;
  size_type local_2f8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_2f0;
  FuncType local_2d8;
  undefined1 local_298 [8];
  Ptr fill_buf_func;
  anon_class_16_2_d8df2ea0 fill_buf;
  undefined8 local_268;
  undefined8 local_260;
  MemoryType local_258;
  undefined1 local_230 [8];
  Ptr memory;
  undefined1 local_210 [8];
  string string_data;
  Callback local_1e8;
  allocator<wabt::Type> local_1c5;
  Type local_1c4;
  iterator local_1c0;
  size_type local_1b8;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_1b0;
  allocator<wabt::Type> local_195;
  Type local_194;
  iterator local_190;
  size_type local_188;
  vector<wabt::Type,_std::allocator<wabt::Type>_> local_180;
  FuncType local_168;
  undefined1 local_128 [8];
  Ptr host_func;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  InterpTest_Rot13_Test *local_10;
  InterpTest_Rot13_Test *this_local;
  
  local_10 = this;
  memcpy((void *)((long)&host_func.root_index_ + 5),&DAT_004e31a8,0xd3);
  std::allocator<unsigned_char>::allocator
            ((allocator<unsigned_char> *)((long)&host_func.root_index_ + 4));
  __l_05._M_len = 0xd3;
  __l_05._M_array = (iterator)((long)&host_func.root_index_ + 5);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&local_28,__l_05,(allocator_type *)((long)&host_func.root_index_ + 4));
  InterpTest::ReadModule(&this->super_InterpTest,&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_28);
  std::allocator<unsigned_char>::~allocator
            ((allocator<unsigned_char> *)((long)&host_func.root_index_ + 4));
  wabt::Type::Type(&local_194,I32);
  local_190 = &local_194;
  local_188 = 1;
  std::allocator<wabt::Type>::allocator(&local_195);
  __l_04._M_len = local_188;
  __l_04._M_array = local_190;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_180,__l_04,&local_195);
  wabt::Type::Type(&local_1c4,I32);
  local_1c0 = &local_1c4;
  local_1b8 = 1;
  std::allocator<wabt::Type>::allocator(&local_1c5);
  __l_03._M_len = local_1b8;
  __l_03._M_array = local_1c0;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_1b0,__l_03,&local_1c5);
  wabt::interp::FuncType::FuncType(&local_168,&local_180,&local_1b0);
  std::
  function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
  ::function<InterpTest_Rot13_Test::TestBody()::__0,void>
            ((function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
              *)&local_1e8,(anon_class_1_0_00000001 *)(string_data.field_2._M_local_buf + 0xf));
  wabt::interp::HostFunc::New
            ((Ptr *)local_128,&(this->super_InterpTest).store_,&local_168,&local_1e8);
  std::
  function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
  ::~function(&local_1e8);
  wabt::interp::FuncType::~FuncType(&local_168);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_1b0);
  std::allocator<wabt::Type>::~allocator(&local_1c5);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_180);
  std::allocator<wabt::Type>::~allocator(&local_195);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)local_210,"Hello, WebAssembly!",(allocator *)((long)&memory.root_index_ + 7))
  ;
  std::allocator<char>::~allocator((allocator<char> *)((long)&memory.root_index_ + 7));
  wabt::Limits::Limits((Limits *)&fill_buf.memory,1);
  limits.max = local_268;
  limits.initial = (uint64_t)fill_buf.memory;
  limits._16_8_ = local_260;
  wabt::interp::MemoryType::MemoryType(&local_258,limits);
  wabt::interp::Memory::New((Ptr *)local_230,&(this->super_InterpTest).store_,&local_258);
  wabt::interp::MemoryType::~MemoryType(&local_258);
  fill_buf_func.root_index_ = (Index)local_210;
  fill_buf.string_data = (string *)local_230;
  wabt::Type::Type(&local_308,I32);
  wabt::Type::Type(&TStack_304,I32);
  local_300 = &local_308;
  local_2f8 = 2;
  std::allocator<wabt::Type>::allocator(&local_309);
  __l_02._M_len = local_2f8;
  __l_02._M_array = local_300;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_2f0,__l_02,&local_309);
  wabt::Type::Type(&local_33c,I32);
  local_338 = &local_33c;
  local_330 = 1;
  std::allocator<wabt::Type>::allocator(&local_33d);
  __l_01._M_len = local_330;
  __l_01._M_array = local_338;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_328,__l_01,&local_33d);
  wabt::interp::FuncType::FuncType(&local_2d8,&local_2f0,&local_328);
  std::
  function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
  ::function<InterpTest_Rot13_Test::TestBody()::__1&,void>
            ((function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
              *)&buf_done.string_data,(anon_class_16_2_d8df2ea0 *)&fill_buf_func.root_index_);
  wabt::interp::HostFunc::New
            ((Ptr *)local_298,&(this->super_InterpTest).store_,&local_2d8,
             (Callback *)&buf_done.string_data);
  std::
  function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
  ::~function((function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
               *)&buf_done.string_data);
  wabt::interp::FuncType::~FuncType(&local_2d8);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_328);
  std::allocator<wabt::Type>::~allocator(&local_33d);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_2f0);
  std::allocator<wabt::Type>::~allocator(&local_309);
  buf_done_func.root_index_ = (Index)local_230;
  buf_done.memory = (Ptr *)local_210;
  wabt::Type::Type(&local_3f8,I32);
  wabt::Type::Type(&TStack_3f4,I32);
  local_3f0 = &local_3f8;
  local_3e8 = 2;
  std::allocator<wabt::Type>::allocator(&local_3f9);
  __l_00._M_len = local_3e8;
  __l_00._M_array = local_3f0;
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_3e0,__l_00,&local_3f9);
  memset(&local_418,0,0x18);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::vector(&local_418);
  wabt::interp::FuncType::FuncType(&local_3c8,&local_3e0,&local_418);
  std::
  function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
  ::function<InterpTest_Rot13_Test::TestBody()::__2&,void>
            ((function<wabt::Result(wabt::interp::Thread&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>const&,std::vector<wabt::interp::Value,std::allocator<wabt::interp::Value>>&,wabt::interp::RefPtr<wabt::interp::Trap>*)>
              *)&local_438,(anon_class_16_2_e78ae302 *)&buf_done_func.root_index_);
  wabt::interp::HostFunc::New
            ((Ptr *)local_388,&(this->super_InterpTest).store_,&local_3c8,&local_438);
  std::
  function<wabt::Result_(wabt::interp::Thread_&,_const_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>_&,_wabt::interp::RefPtr<wabt::interp::Trap>_*)>
  ::~function(&local_438);
  wabt::interp::FuncType::~FuncType(&local_3c8);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_418);
  std::vector<wabt::Type,_std::allocator<wabt::Type>_>::~vector(&local_3e0);
  std::allocator<wabt::Type>::~allocator(&local_3f9);
  this_00 = wabt::interp::RefPtr<wabt::interp::Memory>::operator->
                      ((RefPtr<wabt::interp::Memory> *)local_230);
  local_478 = wabt::interp::Object::self((Object *)this_00);
  pHVar2 = wabt::interp::RefPtr<wabt::interp::HostFunc>::operator->
                     ((RefPtr<wabt::interp::HostFunc> *)local_298);
  local_470 = (size_t)wabt::interp::Object::self((Object *)pHVar2);
  pHVar2 = wabt::interp::RefPtr<wabt::interp::HostFunc>::operator->
                     ((RefPtr<wabt::interp::HostFunc> *)local_388);
  local_468 = (size_t)wabt::interp::Object::self((Object *)pHVar2);
  local_460 = &local_478;
  local_458 = 3;
  std::allocator<wabt::interp::Ref>::allocator
            ((allocator<wabt::interp::Ref> *)((long)&rot13.root_index_ + 7));
  __l._M_len = local_458;
  __l._M_array = local_460;
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::vector
            (&local_450,__l,(allocator_type *)((long)&rot13.root_index_ + 7));
  InterpTest::Instantiate(&this->super_InterpTest,&local_450);
  std::vector<wabt::interp::Ref,_std::allocator<wabt::interp::Ref>_>::~vector(&local_450);
  std::allocator<wabt::interp::Ref>::~allocator
            ((allocator<wabt::interp::Ref> *)((long)&rot13.root_index_ + 7));
  InterpTest::GetFuncExport
            ((Ptr *)&results.
                     super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,&this->super_InterpTest,0);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&trap.root_index_)
  ;
  wabt::interp::RefPtr<wabt::interp::Trap>::RefPtr((RefPtr<wabt::interp::Trap> *)&gtest_ar.message_)
  ;
  local_4dc = Ok;
  pDVar3 = wabt::interp::RefPtr<wabt::interp::DefinedFunc>::operator->
                     ((RefPtr<wabt::interp::DefinedFunc> *)
                      &results.
                       super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                       ._M_impl.super__Vector_impl_data._M_end_of_storage);
  memset(&local_4f8,0,0x18);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector(&local_4f8);
  local_4e0 = wabt::interp::Func::Call
                        (&pDVar3->super_Func,&(this->super_InterpTest).store_,&local_4f8,
                         (Values *)&trap.root_index_,(Ptr *)&gtest_ar.message_,(Stream *)0x0);
  testing::internal::EqHelper<false>::Compare<wabt::Result::Enum,wabt::Result>
            ((EqHelper<false> *)local_4d8,"Result::Ok","rot13->Call(store_, {}, results, &trap)",
             &local_4dc,&local_4e0);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector(&local_4f8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_4d8);
  if (!bVar1) {
    testing::Message::Message(&local_500);
    pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_4d8);
    testing::internal::AssertHelper::AssertHelper
              (&local_508,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
               ,0x21f,pcVar4);
    testing::internal::AssertHelper::operator=(&local_508,&local_500);
    testing::internal::AssertHelper::~AssertHelper(&local_508);
    testing::Message::~Message(&local_500);
  }
  gtest_ar_1.message_.ptr_._5_3_ = 0;
  gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_4d8);
  if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
    testing::internal::EqHelper<false>::Compare<char[20],std::__cxx11::string>
              ((EqHelper<false> *)local_520,"\"Uryyb, JroNffrzoyl!\"","string_data",
               (char (*) [20])"Uryyb, JroNffrzoyl!",
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210);
    bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_520);
    if (!bVar1) {
      testing::Message::Message(&local_528);
      pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_520);
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&gtest_ar_2.message_,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
                 ,0x221,pcVar4);
      testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_528);
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
      testing::Message::~Message(&local_528);
    }
    gtest_ar_1.message_.ptr_._5_3_ = 0;
    gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
    testing::AssertionResult::~AssertionResult((AssertionResult *)local_520);
    if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
      local_544 = Ok;
      pDVar3 = wabt::interp::RefPtr<wabt::interp::DefinedFunc>::operator->
                         ((RefPtr<wabt::interp::DefinedFunc> *)
                          &results.
                           super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage);
      memset(&local_560,0,0x18);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::vector(&local_560);
      local_548 = wabt::interp::Func::Call
                            (&pDVar3->super_Func,&(this->super_InterpTest).store_,&local_560,
                             (Values *)&trap.root_index_,(Ptr *)&gtest_ar.message_,(Stream *)0x0);
      testing::internal::EqHelper<false>::Compare<wabt::Result::Enum,wabt::Result>
                ((EqHelper<false> *)local_540,"Result::Ok","rot13->Call(store_, {}, results, &trap)"
                 ,&local_544,&local_548);
      std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector(&local_560);
      bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_540);
      if (!bVar1) {
        testing::Message::Message(&local_568);
        pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_540);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&gtest_ar_3.message_,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
                   ,0x223,pcVar4);
        testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_568);
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
        testing::Message::~Message(&local_568);
      }
      gtest_ar_1.message_.ptr_._5_3_ = 0;
      gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
      testing::AssertionResult::~AssertionResult((AssertionResult *)local_540);
      if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
        testing::internal::EqHelper<false>::Compare<char[20],std::__cxx11::string>
                  ((EqHelper<false> *)local_580,"\"Hello, WebAssembly!\"","string_data",
                   (char (*) [20])"Hello, WebAssembly!",
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_210);
        bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_580);
        if (!bVar1) {
          testing::Message::Message(&local_588);
          pcVar4 = testing::AssertionResult::failure_message((AssertionResult *)local_580);
          testing::internal::AssertHelper::AssertHelper
                    (&local_590,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]wabt/src/test-interp.cc"
                     ,0x225,pcVar4);
          testing::internal::AssertHelper::operator=(&local_590,&local_588);
          testing::internal::AssertHelper::~AssertHelper(&local_590);
          testing::Message::~Message(&local_588);
        }
        gtest_ar_1.message_.ptr_._5_3_ = 0;
        gtest_ar_1.message_.ptr_._4_1_ = !bVar1;
        testing::AssertionResult::~AssertionResult((AssertionResult *)local_580);
        if (gtest_ar_1.message_.ptr_._4_4_ == 0) {
          gtest_ar_1.message_.ptr_._4_4_ = 0;
        }
      }
    }
  }
  wabt::interp::RefPtr<wabt::interp::Trap>::~RefPtr
            ((RefPtr<wabt::interp::Trap> *)&gtest_ar.message_);
  std::vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>::~vector
            ((vector<wabt::interp::Value,_std::allocator<wabt::interp::Value>_> *)&trap.root_index_)
  ;
  wabt::interp::RefPtr<wabt::interp::DefinedFunc>::~RefPtr
            ((RefPtr<wabt::interp::DefinedFunc> *)
             &results.super__Vector_base<wabt::interp::Value,_std::allocator<wabt::interp::Value>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  wabt::interp::RefPtr<wabt::interp::HostFunc>::~RefPtr((RefPtr<wabt::interp::HostFunc> *)local_388)
  ;
  wabt::interp::RefPtr<wabt::interp::HostFunc>::~RefPtr((RefPtr<wabt::interp::HostFunc> *)local_298)
  ;
  wabt::interp::RefPtr<wabt::interp::Memory>::~RefPtr((RefPtr<wabt::interp::Memory> *)local_230);
  std::__cxx11::string::~string((string *)local_210);
  wabt::interp::RefPtr<wabt::interp::HostFunc>::~RefPtr((RefPtr<wabt::interp::HostFunc> *)local_128)
  ;
  return;
}

Assistant:

TEST_F(InterpTest, Rot13) {
  // (import "host" "mem" (memory $mem 1))
  // (import "host" "fill_buf" (func $fill_buf (param i32 i32) (result i32)))
  // (import "host" "buf_done" (func $buf_done (param i32 i32)))
  //
  // (func $rot13c (param $c i32) (result i32)
  //   (local $uc i32)
  //
  //   ;; No change if < 'A'.
  //   (if (i32.lt_u (get_local $c) (i32.const 65))
  //     (return (get_local $c)))
  //
  //   ;; Clear 5th bit of c, to force uppercase. 0xdf = 0b11011111
  //   (set_local $uc (i32.and (get_local $c) (i32.const 0xdf)))
  //
  //   ;; In range ['A', 'M'] return |c| + 13.
  //   (if (i32.le_u (get_local $uc) (i32.const 77))
  //     (return (i32.add (get_local $c) (i32.const 13))))
  //
  //   ;; In range ['N', 'Z'] return |c| - 13.
  //   (if (i32.le_u (get_local $uc) (i32.const 90))
  //     (return (i32.sub (get_local $c) (i32.const 13))))
  //
  //   ;; No change for everything else.
  //   (return (get_local $c))
  // )
  //
  // (func (export "rot13")
  //   (local $size i32)
  //   (local $i i32)
  //
  //   ;; Ask host to fill memory [0, 1024) with data.
  //   (call $fill_buf (i32.const 0) (i32.const 1024))
  //
  //   ;; The host returns the size filled.
  //   (set_local $size)
  //
  //   ;; Loop over all bytes and rot13 them.
  //   (block $exit
  //     (loop $top
  //       ;; if (i >= size) break
  //       (if (i32.ge_u (get_local $i) (get_local $size)) (br $exit))
  //
  //       ;; mem[i] = rot13c(mem[i])
  //       (i32.store8
  //         (get_local $i)
  //         (call $rot13c
  //           (i32.load8_u (get_local $i))))
  //
  //       ;; i++
  //       (set_local $i (i32.add (get_local $i) (i32.const 1)))
  //       (br $top)
  //     )
  //   )
  //
  //   (call $buf_done (i32.const 0) (get_local $size))
  // )
  ReadModule({
      0x00, 0x61, 0x73, 0x6d, 0x01, 0x00, 0x00, 0x00, 0x01, 0x14, 0x04, 0x60,
      0x02, 0x7f, 0x7f, 0x01, 0x7f, 0x60, 0x02, 0x7f, 0x7f, 0x00, 0x60, 0x01,
      0x7f, 0x01, 0x7f, 0x60, 0x00, 0x00, 0x02, 0x2d, 0x03, 0x04, 0x68, 0x6f,
      0x73, 0x74, 0x03, 0x6d, 0x65, 0x6d, 0x02, 0x00, 0x01, 0x04, 0x68, 0x6f,
      0x73, 0x74, 0x08, 0x66, 0x69, 0x6c, 0x6c, 0x5f, 0x62, 0x75, 0x66, 0x00,
      0x00, 0x04, 0x68, 0x6f, 0x73, 0x74, 0x08, 0x62, 0x75, 0x66, 0x5f, 0x64,
      0x6f, 0x6e, 0x65, 0x00, 0x01, 0x03, 0x03, 0x02, 0x02, 0x03, 0x07, 0x09,
      0x01, 0x05, 0x72, 0x6f, 0x74, 0x31, 0x33, 0x00, 0x03, 0x0a, 0x74, 0x02,
      0x39, 0x01, 0x01, 0x7f, 0x20, 0x00, 0x41, 0xc1, 0x00, 0x49, 0x04, 0x40,
      0x20, 0x00, 0x0f, 0x0b, 0x20, 0x00, 0x41, 0xdf, 0x01, 0x71, 0x21, 0x01,
      0x20, 0x01, 0x41, 0xcd, 0x00, 0x4d, 0x04, 0x40, 0x20, 0x00, 0x41, 0x0d,
      0x6a, 0x0f, 0x0b, 0x20, 0x01, 0x41, 0xda, 0x00, 0x4d, 0x04, 0x40, 0x20,
      0x00, 0x41, 0x0d, 0x6b, 0x0f, 0x0b, 0x20, 0x00, 0x0f, 0x0b, 0x38, 0x01,
      0x02, 0x7f, 0x41, 0x00, 0x41, 0x80, 0x08, 0x10, 0x00, 0x21, 0x00, 0x02,
      0x40, 0x03, 0x40, 0x20, 0x01, 0x20, 0x00, 0x4f, 0x04, 0x40, 0x0c, 0x02,
      0x0b, 0x20, 0x01, 0x20, 0x01, 0x2d, 0x00, 0x00, 0x10, 0x02, 0x3a, 0x00,
      0x00, 0x20, 0x01, 0x41, 0x01, 0x6a, 0x21, 0x01, 0x0c, 0x00, 0x0b, 0x0b,
      0x41, 0x00, 0x20, 0x00, 0x10, 0x01, 0x0b,
  });

  auto host_func =
      HostFunc::New(store_, FuncType{{ValueType::I32}, {ValueType::I32}},
                    [](Thread& thread, const Values& params, Values& results,
                       Trap::Ptr* out_trap) -> Result {
                      results[0] = Value::Make(params[0].Get<u32>() + 1);
                      return Result::Ok;
                    });

  std::string string_data = "Hello, WebAssembly!";

  auto memory = Memory::New(store_, MemoryType{Limits{1}});

  auto fill_buf = [&](Thread& thread, const Values& params, Values& results,
                      Trap::Ptr* out_trap) -> Result {
    // (param $ptr i32) (param $max_size i32) (result $size i32)
    EXPECT_EQ(2u, params.size());
    EXPECT_EQ(1u, results.size());

    u32 ptr = params[0].Get<u32>();
    u32 max_size = params[1].Get<u32>();
    u32 size = std::min(max_size, u32(string_data.size()));

    EXPECT_LT(ptr + size, memory->ByteSize());

    std::copy(string_data.begin(), string_data.begin() + size,
              memory->UnsafeData() + ptr);

    results[0].Set(size);
    return Result::Ok;
  };
  auto fill_buf_func = HostFunc::New(
      store_, FuncType{{ValueType::I32, ValueType::I32}, {ValueType::I32}},
      fill_buf);

  auto buf_done = [&](Thread& thread, const Values& params, Values& results,
                      Trap::Ptr* out_trap) -> Result {
    // (param $ptr i32) (param $size i32)
    EXPECT_EQ(2u, params.size());
    EXPECT_EQ(0u, results.size());

    u32 ptr = params[0].Get<u32>();
    u32 size = params[1].Get<u32>();

    EXPECT_LT(ptr + size, memory->ByteSize());

    string_data.resize(size);
    std::copy(memory->UnsafeData() + ptr, memory->UnsafeData() + ptr + size,
              string_data.begin());

    return Result::Ok;
  };
  auto buf_done_func = HostFunc::New(
      store_, FuncType{{ValueType::I32, ValueType::I32}, {}}, buf_done);

  Instantiate({memory->self(), fill_buf_func->self(), buf_done_func->self()});

  auto rot13 = GetFuncExport(0);

  Values results;
  Trap::Ptr trap;
  ASSERT_EQ(Result::Ok, rot13->Call(store_, {}, results, &trap));

  ASSERT_EQ("Uryyb, JroNffrzoyl!", string_data);

  ASSERT_EQ(Result::Ok, rot13->Call(store_, {}, results, &trap));

  ASSERT_EQ("Hello, WebAssembly!", string_data);
}